

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O3

char * retrieveLOName(Abc_Ntk_t *pNtkOld,Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Aig_Obj_t *pObjPivot,
                     Vec_Ptr_t *vLive,Vec_Ptr_t *vFair)

{
  Abc_Obj_t *pAVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  
  uVar8 = pAigOld->nRegs;
  pcVar4 = (char *)malloc(0x32);
  if ((*(uint *)&pObjPivot->field_0x18 & 7) == 2) {
    iVar11 = pAigNew->nTruePis;
    lVar5 = (long)iVar11;
    if (iVar11 <= (pObjPivot->field_0).CioId) {
      uVar7 = pAigNew->nRegs;
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      else {
        lVar9 = 0;
        do {
          if ((iVar11 < 0) || (pAigNew->vCis->nSize <= lVar5)) goto LAB_0062a616;
          if ((Aig_Obj_t *)pAigNew->vCis->pArray[lVar5] == pObjPivot) {
            uVar7 = -(int)lVar9;
            break;
          }
          lVar9 = lVar9 + -1;
          lVar5 = lVar5 + 1;
        } while ((ulong)uVar7 + lVar9 != 0);
      }
      if ((int)uVar7 < (int)uVar8) {
        uVar7 = uVar7 + pAigOld->nTruePis;
        if (((-1 < (int)uVar7) && ((int)uVar7 < pAigOld->vCis->nSize)) &&
           ((int)uVar7 < pNtkOld->vCis->nSize)) {
          if (*(Aig_Obj_t **)((long)pAigOld->vCis->pArray[uVar7] + 0x28) == pObjPivot) {
            pcVar4 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCis->pArray[uVar7]);
            return pcVar4;
          }
          __assert_fail("pObjOld->pData == pObjPivot",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                        ,0x99,
                        "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
LAB_0062a616:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (uVar7 == uVar8) {
        pcVar6 = "SAVED_LO";
      }
      else {
        uVar2 = uVar8 * 2;
        if ((int)uVar2 < (int)uVar7 || (int)uVar7 <= (int)uVar8) {
          iVar11 = vLive->nSize;
          iVar10 = iVar11 + uVar2 + 1;
          if (((int)uVar2 < (int)uVar7) && ((int)uVar7 < iVar10)) {
            *pcVar4 = '\0';
            if (0 < pAigOld->nTruePos) {
              lVar5 = 0;
              iVar11 = 0;
              do {
                if ((pAigOld->vCos->nSize <= lVar5) || (pNtkOld->vPos->nSize <= lVar5))
                goto LAB_0062a616;
                pAVar1 = (Abc_Obj_t *)pNtkOld->vPos->pArray[lVar5];
                iVar10 = nodeName_starts_with(pAVar1,"assert_fair");
                if (iVar10 != 0) {
                  if (iVar11 == uVar7 + ~uVar2) {
                    pcVar6 = Abc_ObjName(pAVar1);
                    sprintf(pcVar4,"%s__%s",pcVar6,"LIVENESS");
                    if (*pcVar4 != '\0') {
                      return pcVar4;
                    }
                    break;
                  }
                  iVar11 = iVar11 + 1;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < pAigOld->nTruePos);
            }
            __assert_fail("dummyStr[0] != \'\\0\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                          ,0xbb,
                          "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          pcVar6 = "UNKNOWN";
          if ((iVar10 <= (int)uVar7) && ((int)uVar7 < iVar10 + vFair->nSize)) {
            *pcVar4 = '\0';
            if (0 < pAigOld->nTruePos) {
              lVar5 = 0;
              iVar10 = 0;
              do {
                if ((pAigOld->vCos->nSize <= lVar5) || (pNtkOld->vPos->nSize <= lVar5))
                goto LAB_0062a616;
                pAVar1 = (Abc_Obj_t *)pNtkOld->vPos->pArray[lVar5];
                iVar3 = nodeName_starts_with(pAVar1,"assume_fair");
                if (iVar3 != 0) {
                  if (iVar10 == (uVar7 + ~uVar2) - iVar11) {
                    pcVar6 = Abc_ObjName(pAVar1);
                    sprintf(pcVar4,"%s__%s",pcVar6,"FAIRNESS");
                    if (*pcVar4 != '\0') {
                      return pcVar4;
                    }
                    break;
                  }
                  iVar10 = iVar10 + 1;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < pAigOld->nTruePos);
            }
            __assert_fail("dummyStr[0] != \'\\0\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                          ,0xd3,
                          "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
        }
        else {
          uVar8 = uVar7 + ~uVar8 + pAigOld->nTruePis;
          if ((((int)uVar8 < 0) || (pAigOld->vCis->nSize <= (int)uVar8)) ||
             (pNtkOld->vCis->nSize <= (int)uVar8)) goto LAB_0062a616;
          pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCis->pArray[uVar8]);
          sprintf(pcVar4,"%s__%s",pcVar6,"SHADOW");
          pcVar6 = pcVar4;
        }
      }
      return pcVar6;
    }
  }
  __assert_fail("Saig_ObjIsLo( pAigNew, pObjPivot )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                ,0x90,
                "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

char * retrieveLOName( Abc_Ntk_t *pNtkOld, Aig_Man_t *pAigOld, Aig_Man_t *pAigNew, Aig_Obj_t *pObjPivot, Vec_Ptr_t *vLive, Vec_Ptr_t * vFair )
{
    Aig_Obj_t *pObjOld, *pObj;
    Abc_Obj_t *pNode;
    int index, oldIndex, originalLatchNum = Saig_ManRegNum(pAigOld), strMatch, i;
    char *dummyStr = (char *)malloc( sizeof(char) * 50 );

    assert( Saig_ObjIsLo( pAigNew, pObjPivot ) );
    Saig_ManForEachLo( pAigNew, pObj, index )
        if( pObj == pObjPivot )
            break;
    if( index < originalLatchNum )
    {
        oldIndex = Saig_ManPiNum( pAigOld ) + index;
        pObjOld = Aig_ManCi( pAigOld, oldIndex );
        pNode = Abc_NtkCi( pNtkOld, oldIndex );
        assert( pObjOld->pData == pObjPivot );
        return Abc_ObjName( pNode );
    }
    else if( index == originalLatchNum )
        return "SAVED_LO";
    else if( index > originalLatchNum && index < 2 * originalLatchNum + 1 )
    {
        oldIndex = Saig_ManPiNum( pAigOld ) + index - originalLatchNum - 1;
        pObjOld = Aig_ManCi( pAigOld, oldIndex );
        pNode = Abc_NtkCi( pNtkOld, oldIndex );
        sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "SHADOW");
        return dummyStr;
    }
    else if( index >= 2 * originalLatchNum + 1 && index < 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) )
    {
        oldIndex = index - 2 * originalLatchNum - 1;
        strMatch = 0;
        dummyStr[0] = '\0';
        Saig_ManForEachPo( pAigOld, pObj, i )
        {
            pNode = Abc_NtkPo( pNtkOld, i );
            //if( strstr( Abc_ObjName( pNode ), "assert_fair" ) != NULL )
            if(    nodeName_starts_with( pNode, "assert_fair" ) )
            {
                if( strMatch == oldIndex )
                {
                    sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "LIVENESS");
                    //return dummyStr;
                    break;
                }
                else
                    strMatch++;
            }
        }
        assert( dummyStr[0] != '\0' );
        return dummyStr;
    }
    else if( index >= 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) && index < 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) )
    {
        oldIndex = index - 2 * originalLatchNum - 1 - Vec_PtrSize( vLive );
        strMatch = 0;
        dummyStr[0] = '\0';
        Saig_ManForEachPo( pAigOld, pObj, i )
        {
            pNode = Abc_NtkPo( pNtkOld, i );
            //if( strstr( Abc_ObjName( pNode ), "assume_fair" ) != NULL )
            if(    nodeName_starts_with( pNode, "assume_fair" ) )
            {
                if( strMatch == oldIndex )
                {
                    sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "FAIRNESS");
                    //return dummyStr;
                    break;
                }
                else
                    strMatch++;
            }
        }
        assert( dummyStr[0] != '\0' );
        return dummyStr;
    }
    else
        return "UNKNOWN";
}